

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O3

u8 __thiscall GB::Read(GB *this,u16 addr)

{
  u8 uVar1;
  undefined2 in_register_00000032;
  
  uVar1 = (*(code *)(&DAT_0010d89c +
                    *(int *)(&DAT_0010d89c + (ulong)(CONCAT22(in_register_00000032,addr) >> 0xc) * 4
                            )))();
  return uVar1;
}

Assistant:

u8 GB::Read(u16 addr) {
  switch (addr >> 12) {
    case 0: case 1: case 2: case 3: return s.rom0p[addr & 0x3fff];
    case 4: case 5: case 6: case 7: return s.rom1p[addr & 0x3fff];
    case 8: case 9: return using_vram() ? 0xff : s.vramp[addr & 0x1fff];
    case 10: case 11:
      return s.sram_enabled ? s.sramp[addr & cart.sram_addr_mask & 0x1fff]
                            : 0xff;
    case 12: case 14: return s.wram0p[addr & 0xfff];
    case 13: return s.wram1p[addr & 0xfff];
    case 15:
      switch ((addr >> 8) & 0xf) {
        default: return s.wram1p[addr & 0xfff];
        case 14: return using_oam() ? 0xff : s.oam[addr & 0xff];
        case 15: return s.io[addr & 0xff];
      }
  }
  return 0xff;
}